

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

vmdict_TrieNode * __thiscall vmdict_TrieNode::find_word(vmdict_TrieNode *this,char *str,size_t len)

{
  wchar_t wVar1;
  
  if (len != 0) {
    do {
      wVar1 = utf8_ptr::s_getch(str);
      this = this->chi;
      while( true ) {
        if (this == (vmdict_TrieNode *)0x0) {
          return (vmdict_TrieNode *)0x0;
        }
        if (this->ch == wVar1) break;
        this = this->nxt;
      }
      if (this == (vmdict_TrieNode *)0x0) {
        return (vmdict_TrieNode *)0x0;
      }
      len = (size_t)((byte *)str +
                    (len - (long)((byte *)str +
                                 (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                        (uint)((byte)*str >> 7) * 3) + 1)));
      str = (char *)((byte *)str +
                    (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
    } while ((byte *)len != (byte *)0x0);
  }
  return this;
}

Assistant:

vmdict_TrieNode *vmdict_TrieNode::find_word(const char *str, size_t len)
{
    vmdict_TrieNode *n;
    utf8_ptr p((char *)str);

    /* scan the string and walk the Trie */
    for (n = this ; len != 0 ; p.inc(&len))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* find the child node for this letter */
        vmdict_TrieNode *chi;
        for (chi = n->chi ; chi != 0 && chi->ch != ch ; chi = chi->nxt) ;

        /* if we didn't find a child, the word isn't in the trie */
        if (chi == 0)
            return 0;

        /* advance to this child node */
        n = chi;
    }

    /* we've reached the final node for the word - return it */
    return n;
}